

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_100(QPDF *pdf,char *arg2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  char cVar3;
  bool bVar4;
  long lVar5;
  long *plVar6;
  logic_error *plVar7;
  bool raw;
  bool raw_00;
  bool raw_01;
  bool raw_02;
  bool raw_03;
  bool raw_04;
  QPDFObjectHandle *metadata;
  QPDFObjectHandle *metadata_00;
  QPDFObjectHandle *extraout_RDX;
  QPDFObjectHandle *extraout_RDX_00;
  QPDFObjectHandle *extraout_RDX_01;
  QPDFObjectHandle *extraout_RDX_02;
  QPDFObjectHandle *extraout_RDX_03;
  QPDFObjectHandle *pQVar8;
  type ii_1;
  type ii;
  ulong uVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle page_metadata;
  QPDF updated;
  string raw_bytes;
  QPDFObjectHandle copied_root;
  QPDFWriter w;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  QPDFObjectHandle o;
  QPDFObjectHandle root_metadata;
  QPDFObjectHandle root;
  value_type page;
  long local_68 [2];
  QPDFObjectHandle copied_page;
  
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setR6EncryptionParameters
            ((char *)&w,"",true,true,true,true,true,true,qpdf_r3p_low,false);
  QPDFWriter::write();
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  QPDF::QPDF(&updated);
  QPDF::processFile((char *)&updated,"a.pdf");
  QUtil::read_file_into_string_abi_cxx11_((char *)&w);
  QPDF::getRoot();
  paVar1 = &raw_bytes.field_2;
  raw_bytes._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&raw_bytes,"/Metadata","");
  QPDFObjectHandle::getKey((string *)&root_metadata);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)raw_bytes._M_dataplus._M_p != paVar1) {
    operator_delete(raw_bytes._M_dataplus._M_p,raw_bytes.field_2._M_allocated_capacity + 1);
  }
  cVar3 = QPDFObjectHandle::isStream();
  if (cVar3 == '\0') {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test 100 run on file with no metadata");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar4 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&w,(string *)&root_metadata,metadata);
  if (!bVar4) {
    __assert_fail("is_cleartext_in_file(raw_bytes, root_metadata)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xdc0,"void test_100(QPDF &, const char *)");
  }
  bVar4 = test_100::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&root_metadata,(QPDFObjectHandle *)0x1,raw);
  if (bVar4) {
    raw_bytes._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&raw_bytes,"/Pages","");
    QPDFObjectHandle::getKey((string *)&copied_root);
    page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&page,"/Count","");
    QPDFObjectHandle::getKey((string *)&page_metadata);
    lVar5 = QPDFObjectHandle::getIntValue();
    if (lVar5 < 0) {
      QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(lVar5);
    }
    if (page_metadata.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (page_metadata.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)local_68) {
      operator_delete(page.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_68[0] + 1);
    }
    if (copied_root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (copied_root.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)raw_bytes._M_dataplus._M_p != paVar1) {
      operator_delete(raw_bytes._M_dataplus._M_p,raw_bytes.field_2._M_allocated_capacity + 1);
    }
    plVar6 = (long *)QPDF::getAllPages();
    uVar9 = lVar5 - 1;
    lVar5 = *plVar6;
    if (uVar9 < (ulong)(plVar6[1] - lVar5 >> 4)) {
      page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar5 + uVar9 * 0x10);
      page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 8 + uVar9 * 0x10);
      if (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      raw_bytes._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&raw_bytes,"/Metadata","");
      QPDFObjectHandle::getKey((string *)&page_metadata);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)raw_bytes._M_dataplus._M_p != paVar1) {
        operator_delete(raw_bytes._M_dataplus._M_p,raw_bytes.field_2._M_allocated_capacity + 1);
      }
      cVar3 = QPDFObjectHandle::isStream();
      if (cVar3 != '\0') {
        bVar4 = test_100::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&w,(string *)&page_metadata,metadata_00);
        if (bVar4) {
          __assert_fail("!is_cleartext_in_file(raw_bytes, page_metadata)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                        ,0xdc9,"void test_100(QPDF &, const char *)");
        }
        bVar4 = test_100::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&page_metadata,(QPDFObjectHandle *)0x1,raw_00)
        ;
        if (!bVar4) {
          bVar4 = test_100::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)&page_metadata,(QPDFObjectHandle *)0x0,
                             raw_01);
          _Var2 = root_metadata.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          if (!bVar4) {
            __assert_fail("is_cleartext(page_metadata, false)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                          ,0xdcb,"void test_100(QPDF &, const char *)");
          }
          if (root_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (root_metadata.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (root_metadata.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (root_metadata.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (root_metadata.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
          QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&copied_root;
          QPDF::copyForeignObject(QVar10);
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          _Var2._M_pi = page_metadata.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          if (page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (page_metadata.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (page_metadata.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (page_metadata.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (page_metadata.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
          QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&copied_page;
          QPDF::copyForeignObject(QVar11);
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          QPDF::getRoot();
          raw_bytes._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&raw_bytes,"/CopiedRootMetadata","");
          QPDFObjectHandle::replaceKey((string *)&o,(QPDFObjectHandle *)&raw_bytes);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)raw_bytes._M_dataplus._M_p != paVar1) {
            operator_delete(raw_bytes._M_dataplus._M_p,raw_bytes.field_2._M_allocated_capacity + 1);
          }
          if (o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (o.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          QPDF::getRoot();
          raw_bytes._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&raw_bytes,"/CopiedPageMetadata","");
          QPDFObjectHandle::replaceKey((string *)&o,(QPDFObjectHandle *)&raw_bytes);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)raw_bytes._M_dataplus._M_p != paVar1) {
            operator_delete(raw_bytes._M_dataplus._M_p,raw_bytes.field_2._M_allocated_capacity + 1);
          }
          if (o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (o.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          QPDFWriter::QPDFWriter((QPDFWriter *)&raw_bytes,pdf,"b.pdf");
          QPDFWriter::setR6EncryptionParameters
                    ((char *)&raw_bytes,"",true,true,true,true,true,true,qpdf_r3p_low,false);
          QPDFWriter::write();
          if (raw_bytes._M_string_length != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)raw_bytes._M_string_length);
          }
          if (copied_page.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (copied_page.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (copied_root.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (copied_root.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (page_metadata.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (page.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (root_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (root_metadata.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (root.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (_w != (element_type *)&local_c8) {
            operator_delete(_w,(ulong)(local_c8 + 1));
          }
          QPDF::~QPDF(&updated);
          QUtil::read_file_into_string_abi_cxx11_((char *)&raw_bytes);
          QPDF::QPDF(&updated);
          QPDF::processFile((char *)&updated,"b.pdf");
          QPDF::getRoot();
          _w = (element_type *)&local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&w,"/Metadata","");
          QPDFObjectHandle::getKey((string *)&root_metadata);
          if (_w != (element_type *)&local_c8) {
            operator_delete(_w,(ulong)(local_c8 + 1));
          }
          _w = (element_type *)&local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&w,"/Pages","");
          QPDFObjectHandle::getKey((string *)&copied_root);
          page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_68;
          std::__cxx11::string::_M_construct<char_const*>((string *)&page,"/Count","");
          QPDFObjectHandle::getKey((string *)&page_metadata);
          lVar5 = QPDFObjectHandle::getIntValue();
          if (lVar5 < 0) {
            QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(lVar5);
          }
          if (page_metadata.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (page_metadata.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)local_68) {
            operator_delete(page.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            local_68[0] + 1);
          }
          if (copied_root.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (copied_root.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if (_w != (element_type *)&local_c8) {
            operator_delete(_w,(ulong)(local_c8 + 1));
          }
          plVar6 = (long *)QPDF::getAllPages();
          uVar9 = lVar5 - 1;
          lVar5 = *plVar6;
          if (uVar9 < (ulong)(plVar6[1] - lVar5 >> 4)) {
            page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = *(element_type **)(lVar5 + uVar9 * 0x10);
            page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 8 + uVar9 * 0x10);
            if (page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (page.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (page.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (page.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (page.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            _w = (element_type *)&local_c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&w,"/Metadata","");
            QPDFObjectHandle::getKey((string *)&page_metadata);
            if (_w != (element_type *)&local_c8) {
              operator_delete(_w,(ulong)(local_c8 + 1));
            }
            _w = (element_type *)&local_c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&w,"/CopiedRootMetadata","");
            QPDFObjectHandle::getKey((string *)&copied_root);
            if (_w != (element_type *)&local_c8) {
              operator_delete(_w,(ulong)(local_c8 + 1));
            }
            _w = (element_type *)&local_c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&w,"/CopiedPageMetadata","");
            QPDFObjectHandle::getKey((string *)&copied_page);
            pQVar8 = extraout_RDX;
            if (_w != (element_type *)&local_c8) {
              operator_delete(_w,(ulong)(local_c8 + 1));
              pQVar8 = extraout_RDX_00;
            }
            bVar4 = test_100::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)&raw_bytes,(string *)&root_metadata,pQVar8
                              );
            if (bVar4) {
              bVar4 = test_100::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)&root_metadata,(QPDFObjectHandle *)0x1,
                                 raw_02);
              if (!bVar4) {
                __assert_fail("is_cleartext(root_metadata, true)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                              ,0xde3,"void test_100(QPDF &, const char *)");
              }
              _w = page_metadata.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              if (page_metadata.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (page_metadata.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (page_metadata.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (page_metadata.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (page_metadata.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_c8 = copied_root.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_c0 = copied_root.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
              if (copied_root.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (copied_root.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (copied_root.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (copied_root.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (copied_root.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_b8 = copied_page.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_b0 = copied_page.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
              if (copied_page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (copied_page.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (copied_page.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (copied_page.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (copied_page.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              lVar5 = 8;
              pQVar8 = extraout_RDX_01;
              while( true ) {
                o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = *(element_type **)
                          ((long)&copied_root.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + lVar5);
                o.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(&w + lVar5);
                if (o.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (o.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (o.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (o.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _M_use_count = (o.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                bVar4 = test_100::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)&raw_bytes,(string *)&o,pQVar8);
                if (bVar4) {
                  __assert_fail("!is_cleartext_in_file(raw_bytes, o)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                                ,0xde6,"void test_100(QPDF &, const char *)");
                }
                bVar4 = test_100::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)&o,(QPDFObjectHandle *)0x1,raw_03);
                if (bVar4) {
                  __assert_fail("!is_cleartext(o, true)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                                ,0xde7,"void test_100(QPDF &, const char *)");
                }
                bVar4 = test_100::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)&o,(QPDFObjectHandle *)0x0,raw_04);
                if (!bVar4) break;
                pQVar8 = extraout_RDX_02;
                if (o.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (o.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                  pQVar8 = extraout_RDX_03;
                }
                lVar5 = lVar5 + 0x10;
                if (lVar5 == 0x38) {
                  lVar5 = 0x30;
                  do {
                    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                            ((long)&copied_root.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi + lVar5);
                    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                    }
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  if (copied_page.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (copied_page.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (copied_root.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (copied_root.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (page_metadata.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (page_metadata.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (page.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (page.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (root_metadata.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (root_metadata.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (root.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (root.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  QPDF::~QPDF(&updated);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)raw_bytes._M_dataplus._M_p != paVar1) {
                    operator_delete(raw_bytes._M_dataplus._M_p,
                                    raw_bytes.field_2._M_allocated_capacity + 1);
                  }
                  return;
                }
              }
              __assert_fail("is_cleartext(o, false)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                            ,0xde8,"void test_100(QPDF &, const char *)");
            }
          }
          else {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          __assert_fail("is_cleartext_in_file(raw_bytes, root_metadata)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                        ,0xde2,"void test_100(QPDF &, const char *)");
        }
        __assert_fail("!is_cleartext(page_metadata, true)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0xdca,"void test_100(QPDF &, const char *)");
      }
    }
    else {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
    }
    plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar7,"test 100 run on file with no metadata on last page");
    __cxa_throw(plVar7,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  __assert_fail("is_cleartext(root_metadata, true)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xdc1,"void test_100(QPDF &, const char *)");
}

Assistant:

static void
test_100(QPDF& pdf, char const* arg2)
{
    // Designed for compressed-metadata.pdf
    auto is_cleartext = [](QPDFObjectHandle& metadata, bool raw) {
        std::string buf;
        Pl_String bufpl("buffer", nullptr, buf);
        metadata.pipeStreamData(&bufpl, 0, raw ? qpdf_dl_none : qpdf_dl_generalized);
        return buf.substr(0, 9) == "<?xpacket";
    };
    auto is_cleartext_in_file = [](std::string const& raw_bytes,
                                   QPDFObjectHandle& metadata) -> bool {
        auto buf = metadata.getRawStreamData();
        auto offset = metadata.getParsedOffset();
        auto from_file = raw_bytes.substr(QIntC::to_size(offset), 10);
        assert(buf->getSize() > 10);
        auto from_buf = std::string(reinterpret_cast<char*>(buf->getBuffer()), from_file.size());
        return from_buf == from_file;
    };

    {
        QPDFWriter w(pdf, "a.pdf");
        w.setR6EncryptionParameters(
            "", "", true, true, true, true, true, true, qpdf_r3p_full, false);
        w.write();
    }
    {
        QPDF encrypted;
        encrypted.processFile("a.pdf");
        auto raw_bytes = QUtil::read_file_into_string("a.pdf");
        auto root = encrypted.getRoot();
        auto root_metadata = root.getKey("/Metadata");
        if (!root_metadata.isStream()) {
            throw std::logic_error("test 100 run on file with no metadata");
        }
        assert(is_cleartext_in_file(raw_bytes, root_metadata));
        assert(is_cleartext(root_metadata, true));
        auto n_pages = QIntC::to_size(root.getKey("/Pages").getKey("/Count").getIntValue());
        auto page = encrypted.getAllPages().at(n_pages - 1);
        auto page_metadata = page.getKey("/Metadata");
        if (!page_metadata.isStream()) {
            throw std::logic_error("test 100 run on file with no metadata on last page");
        }
        // It's encrypted in the file, but you can recover the data, so it is properly decrypted.
        assert(!is_cleartext_in_file(raw_bytes, page_metadata));
        assert(!is_cleartext(page_metadata, true));
        assert(is_cleartext(page_metadata, false));

        // Now copy these metadata objects to the file and write it out again.
        auto copied_root_metadata = pdf.copyForeignObject(root_metadata);
        auto copied_page_metadata = pdf.copyForeignObject(page_metadata);
        pdf.getRoot().replaceKey("/CopiedRootMetadata", copied_root_metadata);
        pdf.getRoot().replaceKey("/CopiedPageMetadata", copied_root_metadata);
        QPDFWriter w(pdf, "b.pdf");
        w.setR6EncryptionParameters(
            "", "", true, true, true, true, true, true, qpdf_r3p_full, false);
        w.write();
    }
    auto raw_bytes = QUtil::read_file_into_string("b.pdf");
    QPDF updated;
    updated.processFile("b.pdf");
    auto root = updated.getRoot();
    auto root_metadata = root.getKey("/Metadata");
    auto n_pages = QIntC::to_size(root.getKey("/Pages").getKey("/Count").getIntValue());
    auto page = updated.getAllPages().at(n_pages - 1);
    auto page_metadata = page.getKey("/Metadata");
    auto copied_root = root.getKey("/CopiedRootMetadata");
    auto copied_page = root.getKey("/CopiedPageMetadata");
    // The ultimate root is still clear-text in file
    assert(is_cleartext_in_file(raw_bytes, root_metadata));
    assert(is_cleartext(root_metadata, true));
    // Everything else is compressed and encrypted in the file (not handled as special case).
    for (auto o: {page_metadata, copied_root, copied_page}) {
        assert(!is_cleartext_in_file(raw_bytes, o));
        assert(!is_cleartext(o, true));
        assert(is_cleartext(o, false));
    }
}